

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

TypeInfo *
dap::
TypeOf<dap::optional<dap::variant<dap::integer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::type(void)

{
  int iVar1;
  TypeInfo *pTVar2;
  BasicTypeInfo<dap::optional<dap::variant<dap::integer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pBVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (TypeOf<dap::optional<dap::variant<dap::integer,std::__cxx11::string>>>::type()::
      typeinfo_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&TypeOf<dap::optional<dap::variant<dap::integer,std::__cxx11::string>>>
                                 ::type()::typeinfo_abi_cxx11_);
    if (iVar1 != 0) {
      pTVar2 = TypeOf<dap::variant<dap::integer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::type();
      (*pTVar2->_vptr_TypeInfo[2])(&local_68);
      std::operator+(&local_48,"optional<",&local_68);
      std::operator+(&local_28,&local_48,">");
      pBVar3 = TypeInfo::
               create<dap::BasicTypeInfo<dap::optional<dap::variant<dap::integer,std::__cxx11::string>>>,std::__cxx11::string>
                         (&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      TypeOf<dap::optional<dap::variant<dap::integer,std::__cxx11::string>>>::type()::
      typeinfo_abi_cxx11_ = pBVar3;
      __cxa_guard_release(&TypeOf<dap::optional<dap::variant<dap::integer,std::__cxx11::string>>>::
                           type()::typeinfo_abi_cxx11_);
    }
  }
  return &TypeOf<dap::optional<dap::variant<dap::integer,std::__cxx11::string>>>::type()::
          typeinfo_abi_cxx11_->super_TypeInfo;
}

Assistant:

static inline const TypeInfo* type() {
    static auto typeinfo = TypeInfo::create<BasicTypeInfo<optional<T>>>(
        "optional<" + TypeOf<T>::type()->name() + ">");
    return typeinfo;
  }